

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Aggregate_State_PDU::operator==(Aggregate_State_PDU *this,Aggregate_State_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  bool bVar4;
  pointer pKVar5;
  VariableDatum **ppVVar6;
  
  KVar3 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (((((((!KVar3) &&
          (KVar3 = DATA_TYPE::AggregateIdentifier::operator!=
                             (&this->m_AggregateID,&Value->m_AggregateID), !KVar3)) &&
         (this->m_ui8ForceID == Value->m_ui8ForceID)) &&
        ((this->m_ui8AggState == Value->m_ui8AggState &&
         (KVar3 = DATA_TYPE::AggregateType::operator!=
                            (&this->m_AggregateType,&Value->m_AggregateType), !KVar3)))) &&
       ((this->m_ui32Formation == Value->m_ui32Formation &&
        ((KVar3 = DATA_TYPE::AggregateMarking::operator!=
                            (&this->m_AggregateMarking,&Value->m_AggregateMarking), !KVar3 &&
         (KVar3 = DATA_TYPE::Vector::operator!=(&this->m_Dimensions,&Value->m_Dimensions), !KVar3)))
        ))) && (KVar3 = DATA_TYPE::EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori), !KVar3)) &&
     (((((KVar3 = DATA_TYPE::WorldCoordinates::operator!=
                            (&this->m_CtrOfMassLoc,&Value->m_CtrOfMassLoc), !KVar3 &&
         (KVar3 = DATA_TYPE::Vector::operator!=(&this->m_Vel,&Value->m_Vel), !KVar3)) &&
        (this->m_ui16NumAggregates == Value->m_ui16NumAggregates)) &&
       (((this->m_ui16NumEntities == Value->m_ui16NumEntities &&
         (this->m_ui16NumSilentAggregateTypes == Value->m_ui16NumSilentAggregateTypes)) &&
        ((this->m_ui16NumSilentEntityTypes == Value->m_ui16NumSilentEntityTypes &&
         ((bVar4 = std::operator!=(&this->m_vAI,&Value->m_vAI), !bVar4 &&
          (bVar4 = std::operator!=(&this->m_vEI,&Value->m_vEI), !bVar4)))))))) &&
      ((bVar4 = std::operator!=(&this->m_vSASL,&Value->m_vSASL), !bVar4 &&
       (bVar4 = std::operator!=(&this->m_vSESL,&Value->m_vSESL), !bVar4)))))) {
    pKVar1 = (this->m_vVD).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vVD).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar5 = (Value->m_vVD).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vVD).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar5) {
      if (pKVar1 == pKVar2) {
        return true;
      }
      ppVVar6 = &pKVar5->m_pRef;
      do {
        pKVar5 = pKVar1 + 1;
        bVar4 = pKVar1->m_pRef == *ppVVar6;
        if (!bVar4) {
          return bVar4;
        }
        ppVVar6 = ppVVar6 + 3;
        pKVar1 = pKVar5;
      } while (pKVar5 != pKVar2);
      return bVar4;
    }
  }
  return false;
}

Assistant:

KBOOL Aggregate_State_PDU::operator == ( const Aggregate_State_PDU & Value ) const
{
    if( Header::operator                !=( Value ) )                            return false;
    if( m_AggregateID                   != Value.m_AggregateID )                 return false;
    if( m_ui8ForceID                    != Value.m_ui8ForceID )                  return false;
    if( m_ui8AggState                   != Value.m_ui8AggState )                 return false;
    if( m_AggregateType                 != Value.m_AggregateType )               return false;
    if( m_ui32Formation                 != Value.m_ui32Formation )               return false;
    if( m_AggregateMarking              != Value.m_AggregateMarking )            return false;
    if( m_Dimensions                    != Value.m_Dimensions )                  return false;
    if( m_Ori                           != Value.m_Ori )                         return false;
    if( m_CtrOfMassLoc                  != Value.m_CtrOfMassLoc )                return false;
    if( m_Vel                           != Value.m_Vel )                         return false;
    if( m_ui16NumAggregates             != Value.m_ui16NumAggregates )           return false;
    if( m_ui16NumEntities               != Value.m_ui16NumEntities )             return false;
    if( m_ui16NumSilentAggregateTypes   != Value.m_ui16NumSilentAggregateTypes ) return false;
    if( m_ui16NumSilentEntityTypes      != Value.m_ui16NumSilentEntityTypes )    return false;
    if( m_vAI                           != Value.m_vAI )                         return false;
    if( m_vEI                           != Value.m_vEI )                         return false;
    if( m_vSASL                         != Value.m_vSASL )                       return false;
    if( m_vSESL                         != Value.m_vSESL )                       return false;
    if( m_vVD                           != Value.m_vVD )                         return false;
    return true;
}